

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O0

char * get_character_string(int codepoint)

{
  int local_10;
  int length;
  int codepoint_local;
  
  local_10 = wctomb(get_character_string::result,codepoint);
  if (local_10 == -1) {
    local_10 = 0;
  }
  get_character_string::result[local_10] = '\0';
  return get_character_string::result;
}

Assistant:

static const char* get_character_string(int codepoint)
{
    // This assumes UTF-8, which is stupid
    static char result[6 + 1];

    int length = wctomb(result, codepoint);
    if (length == -1)
        length = 0;

    result[length] = '\0';
    return result;
}